

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType1Interpreter.cpp
# Opt level: O1

EStatusCode __thiscall
CharStringType1Interpreter::InterpretNumber
          (CharStringType1Interpreter *this,Byte inBuffer,
          InputCharStringDecodeStream *inCharStringToIntepret)

{
  size_t *psVar1;
  EStatusCode EVar2;
  int iVar3;
  _List_node_base *p_Var4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined7 in_register_00000031;
  _List_node_base *p_Var5;
  Byte byte4;
  Byte byte3;
  Byte byte2;
  Byte byte1_2;
  Byte byte1_1;
  Byte byte1;
  byte local_2e;
  byte local_2d;
  byte local_2c;
  byte local_2b;
  byte local_2a;
  byte local_29;
  
  if ((byte)(inBuffer - 0x20) < 0xd7) {
    p_Var5 = (_List_node_base *)((CONCAT71(in_register_00000031,inBuffer) & 0xffffffff) - 0x8b);
  }
  else if ((byte)(inBuffer + 9) < 4) {
    iVar3 = (*(inCharStringToIntepret->super_IByteReader)._vptr_IByteReader[2])
                      (inCharStringToIntepret,&local_29,1);
    if (CONCAT44(extraout_var,iVar3) != 1) {
      return eFailure;
    }
    p_Var5 = (_List_node_base *)
             (ulong)(((int)CONCAT71(in_register_00000031,inBuffer) * 0x100 + (uint)local_29) -
                    0xf694);
  }
  else if ((byte)(inBuffer + 5) < 4) {
    iVar3 = (*(inCharStringToIntepret->super_IByteReader)._vptr_IByteReader[2])
                      (inCharStringToIntepret,&local_2a,1);
    if (CONCAT44(extraout_var_00,iVar3) != 1) {
      return eFailure;
    }
    p_Var5 = (_List_node_base *)
             (-0x6c - ((ulong)local_2a | (ulong)((uint)inBuffer * 0x100 + 0xff0500 & 0xffff00)));
  }
  else {
    if (inBuffer != 0xff) {
      return eFailure;
    }
    iVar3 = (*(inCharStringToIntepret->super_IByteReader)._vptr_IByteReader[2])
                      (inCharStringToIntepret,&local_2b,1);
    if (CONCAT44(extraout_var_01,iVar3) != 1) {
      return eFailure;
    }
    iVar3 = (*(inCharStringToIntepret->super_IByteReader)._vptr_IByteReader[2])
                      (inCharStringToIntepret,&local_2c,1);
    if (CONCAT44(extraout_var_02,iVar3) != 1) {
      return eFailure;
    }
    iVar3 = (*(inCharStringToIntepret->super_IByteReader)._vptr_IByteReader[2])
                      (inCharStringToIntepret,&local_2d,1);
    if (CONCAT44(extraout_var_03,iVar3) != 1) {
      return eFailure;
    }
    iVar3 = (*(inCharStringToIntepret->super_IByteReader)._vptr_IByteReader[2])
                      (inCharStringToIntepret,&local_2e,1);
    if (CONCAT44(extraout_var_04,iVar3) != 1) {
      return eFailure;
    }
    p_Var5 = (_List_node_base *)
             ((ulong)local_2e |
             (ulong)local_2d << 8 | (long)(int)((uint)local_2b << 0x18) | (ulong)local_2c << 0x10);
  }
  p_Var4 = (_List_node_base *)operator_new(0x18);
  p_Var4[1]._M_next = p_Var5;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(this->mOperandStack).super__List_base<long,_std::allocator<long>_>._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 + 1;
  EVar2 = (*this->mImplementationHelper->_vptr_IType1InterpreterImplementation[0x1a])
                    (this->mImplementationHelper,p_Var5);
  return EVar2;
}

Assistant:

EStatusCode CharStringType1Interpreter::InterpretNumber(Byte inBuffer,InputCharStringDecodeStream* inCharStringToIntepret)
{
	long operand;

	if(32 <= inBuffer && inBuffer <= 246)
	{
		operand = (short)inBuffer - 139;
	}
	else if(247 <= inBuffer && inBuffer <= 250)
	{
		Byte byte1;
		if(inCharStringToIntepret->Read(&byte1,1) != 1)
			return eFailure;

		operand = (inBuffer - 247) * 256 + byte1 + 108;
	}
	else if(251 <= inBuffer && inBuffer <= 254)
	{
		Byte byte1;
		if(inCharStringToIntepret->Read(&byte1,1) != 1)
			return eFailure;

		operand = -(short)(inBuffer - 251) * 256 - byte1 - 108;
	}
	else if(255 == inBuffer)
	{
		Byte byte1,byte2,byte3,byte4;
		
		if(inCharStringToIntepret->Read(&byte1,1) != 1)
			return eFailure;
		if(inCharStringToIntepret->Read(&byte2,1) != 1)
			return eFailure;
		if(inCharStringToIntepret->Read(&byte3,1) != 1)
			return eFailure;
		if(inCharStringToIntepret->Read(&byte4,1) != 1)
			return eFailure;


		operand = (int)(
						((unsigned long)(byte1) << 24) + 
						((unsigned long)(byte2) << 16) + 
						((unsigned long)(byte3) << 8) + 
						(byte4));
	}
	else
		return eFailure;

	mOperandStack.push_back(operand);
	return mImplementationHelper->Type1InterpretNumber(operand);
}